

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

Prim * tinyusdz::tydra::GetParentPrim(Stage *stage,Path *path,string *err)

{
  bool bVar1;
  value_type *ppPVar2;
  error_type *__rhs;
  undefined1 in_CL;
  value_type pPVar3;
  expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  string local_1a0;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  Path parentPath;
  
  if (path->_valid == false) {
    if (err != (string *)0x0) {
      tinyusdz::to_string_abi_cxx11_(&local_1a0,(tinyusdz *)path,(Path *)0x1,(bool)in_CL);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret,
                       "Input Path ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1a0);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &parentPath,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret,
                       " is invalid.\n");
      ::std::__cxx11::string::operator=((string *)err,(string *)&parentPath);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
  }
  else {
    bVar1 = Path::is_root_path(path);
    if ((((!bVar1) && (bVar1 = Path::is_root_prim(path), !bVar1)) &&
        ((path->_prim_part)._M_string_length != 0)) && (*(path->_prim_part)._M_dataplus._M_p == '/')
       ) {
      Path::get_parent_prim_path(&parentPath,path);
      Stage::GetPrimAtPath_abi_cxx11_(&ret,stage,&parentPath);
      if (ret.contained.
          super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        ppPVar2 = nonstd::expected_lite::
                  expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::value(&ret);
        pPVar3 = *ppPVar2;
      }
      else {
        if (err != (string *)0x0) {
          tinyusdz::to_string_abi_cxx11_(&local_180,(tinyusdz *)path,(Path *)0x1,(bool)in_CL);
          ::std::operator+(&local_160,"Failed to get parent Prim from Path ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_180);
          ::std::operator+(&local_140,&local_160,". Reason = ");
          __rhs = nonstd::expected_lite::
                  expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::error(&ret);
          ::std::operator+(&local_120,&local_140,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __rhs);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1a0,&local_120,"\n");
          ::std::__cxx11::string::append((string *)err);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        pPVar3 = (value_type)0x0;
      }
      nonstd::expected_lite::
      expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
      Path::~Path(&parentPath);
      return pPVar3;
    }
    if (err != (string *)0x0) {
      ::std::__cxx11::string::assign((char *)err);
    }
  }
  return (Prim *)0x0;
}

Assistant:

const Prim *GetParentPrim(const tinyusdz::Stage &stage,
                          const tinyusdz::Path &path, std::string *err) {
  if (!path.is_valid()) {
    if (err) {
      (*err) = "Input Path " + tinyusdz::to_string(path) + " is invalid.\n";
    }
    return nullptr;
  }

  if (path.is_root_path()) {
    if (err) {
      (*err) = "Input Path is root(\"/\").\n";
    }
    return nullptr;
  }

  if (path.is_root_prim()) {
    if (err) {
      (*err) = "Input Path is root Prim, so no parent Prim exists.\n";
    }
    return nullptr;
  }

  if (!path.is_absolute_path()) {
    if (err) {
      (*err) = "Input Path must be absolute path(i.e. starts with \"/\").\n";
    }
    return nullptr;
  }

  tinyusdz::Path parentPath = path.get_parent_prim_path();

  nonstd::expected<const Prim *, std::string> ret =
      stage.GetPrimAtPath(parentPath);
  if (ret) {
    return ret.value();
  } else {
    if (err) {
      (*err) += "Failed to get parent Prim from Path " +
                tinyusdz::to_string(path) + ". Reason = " + ret.error() + "\n";
    }
    return nullptr;
  }
}